

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double beta_cdf_inv_old(double cdf,double a,double b)

{
  double dVar1;
  double dVar2;
  double local_c80;
  double xold;
  double x;
  double tail;
  double t;
  double sum2;
  double s2;
  double s1;
  double q;
  double pdf_x;
  int loopct;
  int k;
  int j;
  int i;
  double errapp;
  double error;
  double d [380];
  double cdf_x;
  double bcoeff;
  double b_local;
  double a_local;
  double cdf_local;
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
    exit(1);
  }
  xold = a / (a + b);
  local_c80 = 0.0;
  pdf_x._0_4_ = 2;
  do {
    if (ABS((xold - local_c80) / xold) < 0.01 || pdf_x._0_4_ == 0) {
      return xold;
    }
    local_c80 = xold;
    pdf_x._0_4_ = pdf_x._0_4_ + -1;
    d[0x17b] = beta_cdf(xold,a,b);
    dVar1 = beta_pdf(xold,a,b);
    dVar1 = (cdf - d[0x17b]) / dVar1;
    dVar2 = 1.0 - xold;
    s2 = (dVar1 * (b - 1.0)) / dVar2;
    sum2 = (dVar1 * (1.0 - a)) / xold;
    d[0] = s2 + sum2;
    x = ((s2 + sum2) * dVar1) / 2.0;
    xold = xold + dVar1 + x;
    for (pdf_x._4_4_ = 3; 0.0001 < ABS(x / xold) && pdf_x._4_4_ < 0x15;
        pdf_x._4_4_ = pdf_x._4_4_ + 1) {
      s2 = (dVar1 * ((double)pdf_x._4_4_ - 2.0) * s2) / dVar2;
      sum2 = (dVar1 * (2.0 - (double)pdf_x._4_4_) * sum2) / xold;
      d[(long)((pdf_x._4_4_ + -2) * 0x14 + 1) + -1] = s2 + sum2;
      for (k = 3; k <= pdf_x._4_4_ + -1; k = k + 1) {
        t = d[0] * d[(long)(k * -0x13 + -2 + pdf_x._4_4_ * 0x14) + -1];
        cdf_x = 1.0;
        for (loopct = 1; loopct <= pdf_x._4_4_ - k; loopct = loopct + 1) {
          cdf_x = (cdf_x * (double)(((pdf_x._4_4_ - k) - loopct) + 1)) / (double)loopct;
          t = cdf_x * d[(long)(loopct * 0x14 + 1) + -1] *
              d[(long)(k * -0x13 + -2 + pdf_x._4_4_ * 0x14 + loopct * -0x14) + -1] + t;
        }
        d[(long)(k * -0x13 + -1 + pdf_x._4_4_ * 0x14) + -1] =
             t + d[(long)(k * -0x13 + pdf_x._4_4_ * 0x14 + 0x12) + -1] / (double)(k + -1);
      }
      d[(long)(pdf_x._4_4_ + -1) + -1] =
           d[0] * d[(long)(pdf_x._4_4_ + -2) + -1] +
           d[(long)(pdf_x._4_4_ + 0x12) + -1] / (double)(pdf_x._4_4_ + -1);
      x = (d[(long)(pdf_x._4_4_ + -1) + -1] * dVar1) / (double)pdf_x._4_4_;
      xold = xold + x;
      if ((xold <= 0.0) || (1.0 <= xold)) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  The series has diverged.\n");
        return -1.0;
      }
    }
  } while( true );
}

Assistant:

double beta_cdf_inv_old ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV_OLD inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    22 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Abernathy and Smith.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Abernathy, Smith,
//    Algorithm 724,
//    ACM Transactions on Mathematical Software,
//    Volume 19, Number 4, December 1993, pages 481-483.
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_CDF_INV, the argument of the CDF.
//
{
# define MAXK 20

  double bcoeff;
  double cdf_x;
  double d[MAXK * (MAXK-1)];
  double error = 0.0001;
  double errapp = 0.01;
  int i;
  int j;
  int k;
  int loopct;
  double pdf_x;
  double q;
  double s1;
  double s2;
  double sum2;
  double t;
  double tail;
  double x;
  double xold;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }
//
//  Estimate the solution.
//
  x = a / ( a + b );

  xold = 0.0;
  loopct = 2;

  while ( errapp <= fabs ( ( x - xold ) / x ) && loopct != 0 )
  {
    xold = x;
    loopct = loopct - 1;
//
//  CDF_X = PROB { BETA(A,B) <= X }.
//  Q = ( CDF - CDF_X ) / PDF_X.
//
    cdf_x = beta_cdf ( x, a, b );

    pdf_x = beta_pdf ( x, a, b );

    q = ( cdf - cdf_x ) / pdf_x;
//
//  D(N,K) = C(N,K) * Q**(N+K-1) / (N-1)!
//
    t = 1.0 - x;
    s1 = q * ( b - 1.0 ) / t;
    s2 = q * ( 1.0 - a ) / x;
    d[2-1+0*MAXK] = s1 + s2;
    tail = d[2-1+0*MAXK] * q / 2.0;
    x = x + q + tail;

    k = 3;

    while ( error < fabs ( tail / x ) && k <= MAXK )
    {
//
//  Find D(2,K-2).
//
      s1 = q * ( static_cast<double>(k ) - 2.0 ) * s1 / t;
      s2 = q * ( 2.0 - static_cast<double>(k ) ) * s2 / x;
      d[2-1+(k-2)*MAXK] = s1 + s2;
//
//  Find D(3,K-3), D(4,K-4), D(5,K-5), ... , D(K-1,1).
//
      for ( i = 3; i <= k-1; i++ )
      {
        sum2 = d[2-1+0*MAXK] * d[i-2+(k-i)*MAXK];
        bcoeff = 1.0;

        for ( j = 1; j <= k - i; j++ )
        {
          bcoeff = ( bcoeff * static_cast<double>(k - i - j + 1 ) )
            / static_cast<double>(j );
          sum2 = sum2 + bcoeff * d[2-1+j*MAXK] * d[i-2+(k-i-j)*MAXK];
        }
        d[i-1+(k-i)*MAXK] = sum2 + d[i-2+(k-i+1)*MAXK] / static_cast<double>(i - 1 );
      }
//
//  Compute D(K,0) and use it to expand the series.
//
      d[k-1+0*MAXK] = d[2-1+0*MAXK] * d[k-2+0*MAXK] + d[k-2+1*MAXK]
        / static_cast<double>(k - 1 );
      tail = d[k-1+0*MAXK] * q / static_cast<double>(k );
      x = x + tail;
//
//  Check for divergence.
//
      if ( x <= 0.0 || 1.0 <= x )
      {
        cerr << " \n";
        cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
        cerr << "  The series has diverged.\n";
        x = -1.0;
        return x;
      }
      k = k + 1;
    }
  }
  return x;
# undef MAXK
}